

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall
cppcms::application::render(application *this,string *template_name,base_content *content)

{
  manager *this_00;
  context *this_01;
  response *this_02;
  ostream *out;
  app_guard g;
  app_guard aStack_48;
  string local_40;
  
  base_content::app_guard::app_guard(&aStack_48,content,this);
  this_00 = cppcms::service::views_pool(((this->d).ptr_)->service);
  this_01 = context(this);
  http::context::skin_abi_cxx11_(&local_40,this_01);
  this_02 = response(this);
  out = http::response::out(this_02);
  views::manager::render(this_00,&local_40,template_name,out,content);
  std::__cxx11::string::~string((string *)&local_40);
  base_content::app_guard::~app_guard(&aStack_48);
  return;
}

Assistant:

void application::render(std::string template_name,base_content &content)
{
	base_content::app_guard g(content,*this);
	service().views_pool().render(context().skin(),template_name,response().out(),content);
}